

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pasteboard.c
# Opt level: O0

void wpe_pasteboard_string_initialize
               (wpe_pasteboard_string *string,char *in_string,uint64_t in_length)

{
  char *pcVar1;
  uint64_t in_length_local;
  char *in_string_local;
  wpe_pasteboard_string *string_local;
  
  if (string->data == (char *)0x0) {
    pcVar1 = (char *)wpe_calloc_impl(in_length,1,
                                     "/workspace/llm4binary/github/license_c_cmakelists/WebPlatformForEmbedded[P]libwpe/src/pasteboard.c"
                                     ,0x29);
    string->data = pcVar1;
    string->length = in_length;
    memcpy(string->data,in_string,in_length);
  }
  return;
}

Assistant:

void
wpe_pasteboard_string_initialize(struct wpe_pasteboard_string* string, const char* in_string, uint64_t in_length)
{
    if (string->data)
        return;

    string->data = wpe_calloc(in_length, sizeof(char));
    string->length = in_length;
    memcpy(string->data, in_string, in_length);
}